

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O3

void ncnn::convdw3x3s1_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_dequant,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  pointer pfVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  uint uVar12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  uint uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  void *pvVar22;
  void *pvVar23;
  int iVar24;
  void *pvVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  void *pvVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int size;
  
  auVar15 = _DAT_005b18a0;
  auVar14 = _DAT_005b1880;
  iVar2 = top_blob->c;
  if (0 < (long)iVar2) {
    iVar3 = top_blob->w;
    iVar4 = top_blob->h;
    iVar5 = bottom_blob->w;
    pvVar6 = top_blob->data;
    uVar7 = top_blob->elemsize;
    lVar18 = top_blob->cstep * uVar7;
    lVar26 = 0;
    iVar24 = (int)((uVar7 * (long)iVar3 * (long)iVar4 + 0xf & 0xfffffffffffffff0) / uVar7);
    if (top_blob->dims == 4) {
      iVar24 = (int)((long)iVar3 * (long)iVar4);
    }
    uVar16 = iVar24 * top_blob->d;
    pfVar8 = (scales_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar9 = bottom_blob->cstep;
    sVar10 = bottom_blob->elemsize;
    pvVar11 = bottom_blob->data;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = (ulong)uVar16 - 1;
    auVar30 = vpshufd_avx(auVar30,0x44);
    uVar7 = auVar30._0_8_;
    auVar31._0_8_ = uVar7 ^ 0x8000000000000000;
    auVar31._8_4_ = auVar30._8_4_;
    uVar12 = auVar30._12_4_;
    auVar31._12_4_ = uVar12 ^ 0x80000000;
    auVar30 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
    pvVar29 = pvVar6;
    do {
      if (_bias == (Mat *)0x0) {
        auVar32 = ZEXT816(0) << 0x40;
      }
      else {
        auVar32 = ZEXT416(*(uint *)((long)&_bias->data + lVar26 * 4));
      }
      fVar1 = pfVar8[lVar26];
      if (0 < (int)uVar16) {
        auVar32 = vshufps_avx(auVar32,auVar32,0);
        auVar33._16_16_ = auVar32;
        auVar33._0_16_ = auVar32;
        uVar19 = 0;
        do {
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar19;
          auVar32 = vpshufd_avx(auVar32,0x44);
          auVar35._16_16_ = auVar32;
          auVar35._0_16_ = auVar32;
          auVar36 = vorps_avx(auVar35,auVar14);
          auVar35 = vorps_avx(auVar35,auVar15);
          auVar38._0_8_ = auVar35._16_8_ ^ 0x8000000000000000;
          auVar38._8_4_ = auVar35._24_4_;
          auVar38._12_4_ = auVar35._28_4_ ^ 0x80000000;
          auVar32 = vpcmpgtq_avx(auVar38,auVar31);
          auVar40._0_8_ = uVar7 ^ 0x8000000000000000;
          auVar40._8_4_ = auVar31._8_4_;
          auVar40._12_4_ = uVar12 ^ 0x80000000;
          auVar34._0_8_ = auVar35._0_8_ ^ 0x8000000000000000;
          auVar34._8_4_ = auVar35._8_4_;
          auVar34._12_4_ = auVar35._12_4_ ^ 0x80000000;
          auVar34 = vpcmpgtq_avx(auVar34,auVar40);
          auVar32 = vpackssdw_avx(auVar34,auVar32);
          auVar39._0_8_ = auVar36._16_8_ ^ 0x8000000000000000;
          auVar39._8_4_ = auVar36._24_4_;
          auVar39._12_4_ = auVar36._28_4_ ^ 0x80000000;
          auVar34 = vpcmpgtq_avx(auVar39,auVar31);
          auVar41._0_8_ = uVar7 ^ 0x8000000000000000;
          auVar41._8_4_ = auVar31._8_4_;
          auVar41._12_4_ = uVar12 ^ 0x80000000;
          auVar37._0_8_ = auVar36._0_8_ ^ 0x8000000000000000;
          auVar37._8_4_ = auVar36._8_4_;
          auVar37._12_4_ = auVar36._12_4_ ^ 0x80000000;
          auVar37 = vpcmpgtq_avx(auVar37,auVar41);
          auVar34 = vpackssdw_avx(auVar37,auVar34);
          auVar32 = vpackssdw_avx(auVar34 ^ auVar30,auVar32 ^ auVar30);
          auVar34 = vpmovsxwd_avx(auVar32);
          auVar32 = vpunpckhwd_avx(auVar32,auVar32);
          auVar36._16_16_ = auVar32;
          auVar36._0_16_ = auVar34;
          auVar36 = vmaskmovps_avx(auVar36,auVar33);
          *(undefined1 (*) [32])((long)pvVar29 + uVar19 * 4) = auVar36;
          uVar19 = uVar19 + 8;
        } while ((uVar16 + 7 & 0xfffffff8) != uVar19);
      }
      if (0 < iVar4) {
        pvVar25 = (void *)(lVar18 * lVar26 + (long)pvVar6);
        lVar13 = lVar26 * 9;
        pvVar22 = (void *)(sVar9 * sVar10 * lVar26 + (long)pvVar11);
        pvVar23 = (void *)((long)pvVar22 + (long)iVar5 * 2);
        lVar21 = (long)pvVar22 + (long)iVar5;
        iVar24 = 0;
        do {
          if (0 < iVar3) {
            lVar28 = 2;
            lVar20 = 0;
            lVar27 = 0;
            uVar17 = iVar3 + 1;
            do {
              *(float *)((long)pvVar25 + lVar28 * 4 + -8) =
                   fVar1 * (float)((int)*(char *)((long)&_kernel->refcount + lVar13) *
                                   (int)*(char *)((long)pvVar23 + lVar28) +
                                   (int)*(char *)((long)&_kernel->data + lVar13 + 7) *
                                   (int)*(char *)((long)pvVar23 + lVar28 + -1) +
                                  (int)*(char *)((long)&_kernel->data + lVar13 + 6) *
                                  (int)*(char *)((long)pvVar23 + lVar28 + -2) +
                                  (int)*(char *)((long)&_kernel->data + lVar13 + 5) *
                                  (int)*(char *)(lVar21 + lVar28) +
                                  (int)*(char *)((long)&_kernel->data + lVar13 + 4) *
                                  (int)*(char *)(lVar21 + -1 + lVar28) +
                                  (int)*(char *)((long)&_kernel->data + lVar13 + 3) *
                                  (int)*(char *)(lVar21 + -2 + lVar28) +
                                  (int)*(char *)((long)&_kernel->data + lVar13 + 2) *
                                  (int)*(char *)((long)pvVar22 + lVar28) +
                                  (int)*(char *)((long)&_kernel->data + lVar13 + 1) *
                                  (int)*(char *)((long)pvVar22 + lVar28 + -1) +
                                  (int)*(char *)((long)&_kernel->data + lVar13) *
                                  (int)*(char *)((long)pvVar22 + lVar28 + -2)) +
                   *(float *)((long)pvVar25 + lVar28 * 4 + -8);
              uVar17 = uVar17 - 1;
              lVar27 = lVar27 + -1;
              lVar28 = lVar28 + 1;
              lVar20 = lVar20 + -4;
            } while (1 < uVar17);
            pvVar23 = (void *)((long)pvVar23 - lVar27);
            lVar21 = lVar21 - lVar27;
            pvVar22 = (void *)((long)pvVar22 - lVar27);
            pvVar25 = (void *)((long)pvVar25 - lVar20);
          }
          pvVar22 = (void *)((long)pvVar22 + 2);
          lVar21 = lVar21 + 2;
          pvVar23 = (void *)((long)pvVar23 + 2);
          iVar24 = iVar24 + 1;
        } while (iVar24 != iVar4);
      }
      lVar26 = lVar26 + 1;
      pvVar29 = (void *)((long)pvVar29 + lVar18);
    } while (lVar26 != iVar2);
  }
  return;
}

Assistant:

static void convdw3x3s1_int8_dequant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, std::vector<float> scales_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        float* outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_dequant = scales_dequant[p];

        out.fill(bias0);

        const signed char* kernel0 = (const signed char*)kernel + p * 9;

        const signed char* img0 = bottom_blob.channel(p);
        const signed char* r0 = img0;
        const signed char* r1 = img0 + w;
        const signed char* r2 = img0 + w * 2;

        int i = 0;
        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += (float)sum * scale_dequant;

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}